

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

bool __thiscall gl4cts::DirectStateAccess::Framebuffers::BlitTest::CheckStencil(BlitTest *this)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GLint (*paGVar2) [3];
  long lVar3;
  bool bVar4;
  long lVar5;
  undefined8 *puVar6;
  bool bVar7;
  GLint stencil [2] [3];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  puVar6 = &local_1b8;
  local_1b8 = 0;
  uStack_1b0 = 0;
  local_1a8 = 0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x1220))(0,0,3,2,0x1901,0x1404,puVar6);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"glReadPixels has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0xbc1);
  paGVar2 = CheckStencil::reference;
  bVar4 = false;
  lVar5 = 0;
  do {
    lVar3 = 0;
    do {
      if ((*paGVar2)[lVar3] != *(int *)((long)puVar6 + lVar3 * 4)) {
        local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
        this_00 = (ostringstream *)(local_1a0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"Blitted framebuffer stencil buffer contains [",0x2d);
        std::ostream::operator<<(this_00,(int)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,local_1b8._4_4_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,(int)uStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", \n",3);
        std::ostream::operator<<(this_00,uStack_1b0._4_4_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,(int)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,local_1a8._4_4_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"], but ",7);
        std::ostream::operator<<(this_00,1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", \n",3);
        std::ostream::operator<<(this_00,4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
        std::ostream::operator<<(this_00,4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"] was expected.",0xf)
        ;
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_128);
        return bVar4;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    paGVar2 = paGVar2 + 1;
    puVar6 = (undefined8 *)((long)puVar6 + 0xc);
    bVar7 = lVar5 == 0;
    bVar4 = !bVar7;
    lVar5 = lVar5 + 1;
  } while (bVar7);
  return bVar4;
}

Assistant:

bool BlitTest::CheckStencil()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reference values. */
	static const glw::GLint reference[2][3] = { { 1, 2, 3 }, { 4, 4, 4 } };

	/* Copy buffer. */
	glw::GLint stencil[2][3] = { { 0 } };

	/* Reading from GL. */
	gl.readPixels(0, 0, 3, 2, GL_STENCIL_INDEX, GL_INT, stencil);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels has failed");

	/* Comparison against the reference. */
	for (glw::GLuint j = 0; j < 2; ++j)
	{
		for (glw::GLuint i = 0; i < 3; ++i)
		{
			if (reference[j][i] != stencil[j][i])
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Blitted framebuffer stencil buffer contains [" << stencil[0][0] << ", "
					<< stencil[0][1] << ", " << stencil[0][2] << ", \n"
					<< stencil[1][0] << ", " << stencil[1][1] << ", " << stencil[1][2] << "], but " << reference[0][0]
					<< ", " << reference[0][1] << ", " << reference[0][2] << ", \n"
					<< reference[1][0] << ", " << reference[1][1] << ", " << reference[1][2] << "] was expected."
					<< tcu::TestLog::EndMessage;

				return false;
			}
		}
	}

	return true;
}